

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

int secp256k1_ge_x_frac_on_curve_var(secp256k1_fe *xn,secp256k1_fe *xd)

{
  secp256k1_fe *r;
  uint uVar1;
  int iVar2;
  int extraout_EAX;
  uint uVar3;
  int extraout_EAX_00;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  secp256k1_scalar *a;
  long lVar8;
  secp256k1_ge *psVar9;
  secp256k1_ge *psVar10;
  secp256k1_gej *r_00;
  secp256k1_gej *psVar11;
  secp256k1_gej *psVar12;
  secp256k1_gej *in_R8;
  undefined1 *puVar13;
  bool bVar14;
  uint uStack_508;
  uint uStack_504;
  secp256k1_gej *psStack_500;
  uint uStack_4f4;
  secp256k1_ge *psStack_4f0;
  secp256k1_ge *psStack_4e8;
  ulong uStack_4e0;
  uint uStack_4d4;
  secp256k1_fe sStack_4d0;
  secp256k1_ge sStack_4a0;
  secp256k1_fe sStack_430;
  secp256k1_ge asStack_400 [4];
  secp256k1_ge asStack_260 [4];
  secp256k1_fe *psStack_b8;
  undefined1 *puStack_b0;
  uint64_t local_88;
  uint64_t uStack_80;
  uint64_t local_78;
  uint64_t uStack_70;
  uint64_t local_68;
  int local_60;
  int local_5c;
  uint64_t local_58;
  uint64_t uStack_50;
  uint64_t local_48;
  uint64_t uStack_40;
  uint64_t local_38;
  int local_30;
  int local_2c;
  
  psVar10 = (secp256k1_ge *)&stack0xffffffffffffff78;
  psVar11 = (secp256k1_gej *)&stack0xffffffffffffff78;
  psVar12 = (secp256k1_gej *)&stack0xffffffffffffff78;
  puVar13 = (undefined1 *)0x1000003d0;
  secp256k1_fe_verify(xd);
  uVar4 = (xd->n[4] >> 0x30) * 0x1000003d1 + xd->n[0];
  if (((uVar4 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar4 & 0xfffffffffffff) == 0)) {
    uVar7 = (uVar4 >> 0x34) + xd->n[1];
    psVar9 = (secp256k1_ge *)((uVar7 >> 0x34) + xd->n[2]);
    r_00 = (secp256k1_gej *)(((ulong)psVar9 >> 0x34) + xd->n[3]);
    in_R8 = (secp256k1_gej *)(((ulong)r_00 >> 0x34) + (xd->n[4] & 0xffffffffffff));
    if ((((uVar7 | uVar4 | (ulong)psVar9 | (ulong)r_00) & 0xfffffffffffff) != 0 ||
         in_R8 != (secp256k1_gej *)0x0) &&
       (in_R8 = (secp256k1_gej *)((ulong)in_R8 ^ 0xf000000000000),
       ((uVar4 | 0x1000003d0) & uVar7 & (ulong)psVar9 & (ulong)r_00 & (ulong)in_R8) !=
       0xfffffffffffff)) goto LAB_0011b27e;
    secp256k1_ge_x_frac_on_curve_var_cold_1();
    psVar10 = psVar9;
  }
  else {
LAB_0011b27e:
    secp256k1_fe_mul((secp256k1_fe *)&stack0xffffffffffffffa8,xd,xn);
    secp256k1_fe_sqr((secp256k1_fe *)&stack0xffffffffffffff78,xn);
    secp256k1_fe_mul((secp256k1_fe *)&stack0xffffffffffffffa8,
                     (secp256k1_fe *)&stack0xffffffffffffffa8,
                     (secp256k1_fe *)&stack0xffffffffffffff78);
    secp256k1_fe_sqr((secp256k1_fe *)&stack0xffffffffffffff78,xd);
    secp256k1_fe_sqr((secp256k1_fe *)&stack0xffffffffffffff78,
                     (secp256k1_fe *)&stack0xffffffffffffff78);
    secp256k1_fe_verify((secp256k1_fe *)&stack0xffffffffffffff78);
    r_00 = psVar11;
    puVar13 = (undefined1 *)&stack0xffffffffffffff78;
    if (local_60 < 0x11) {
      local_88 = local_88 * 2;
      uStack_80 = uStack_80 * 2;
      local_78 = local_78 * 2;
      uStack_70 = uStack_70 * 2;
      local_68 = local_68 << 1;
      local_60 = local_60 * 2;
      local_5c = 0;
      secp256k1_fe_verify((secp256k1_fe *)&stack0xffffffffffffff78);
      secp256k1_fe_verify((secp256k1_fe *)&stack0xffffffffffffffa8);
      secp256k1_fe_verify((secp256k1_fe *)&stack0xffffffffffffff78);
      local_30 = local_60 + local_30;
      xd = (secp256k1_fe *)&stack0xffffffffffffff78;
      r_00 = psVar12;
      puVar13 = (undefined1 *)&stack0xffffffffffffff78;
      if (local_30 < 0x21) {
        local_58 = local_58 + local_88;
        uStack_50 = uStack_50 + uStack_80;
        local_48 = local_48 + local_78;
        uStack_40 = uStack_40 + uStack_70;
        local_38 = local_38 + local_68;
        local_2c = 0;
        secp256k1_fe_verify((secp256k1_fe *)&stack0xffffffffffffffa8);
        iVar2 = secp256k1_fe_is_square_var((secp256k1_fe *)&stack0xffffffffffffffa8);
        return iVar2;
      }
      goto LAB_0011b38a;
    }
  }
  secp256k1_ge_x_frac_on_curve_var_cold_3();
LAB_0011b38a:
  secp256k1_ge_x_frac_on_curve_var_cold_2();
  psStack_b8 = xd;
  puStack_b0 = puVar13;
  secp256k1_ge_verify(psVar10);
  if (psVar10->infinity != 0) {
    secp256k1_gej_set_infinity(r_00);
    return extraout_EAX;
  }
  psStack_500 = r_00;
  secp256k1_scalar_add(&uStack_4d4,a,&secp256k1_ecmult_const_K);
  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStack_4d4);
  uStack_4d4 = (-(uStack_4d4 & 1) & 0xd) + uStack_4d4 >> 1;
  secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStack_4d4);
  secp256k1_scalar_split_lambda(&uStack_504,&uStack_508,&uStack_4d4);
  secp256k1_scalar_add(&uStack_504,&uStack_504,&secp256k1_ecmult_const::S_OFFSET);
  secp256k1_scalar_add(&uStack_508,&uStack_508,&secp256k1_ecmult_const::S_OFFSET);
  iVar2 = 0x7f;
  do {
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStack_504);
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStack_508);
    psVar11 = psStack_500;
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  secp256k1_gej_set_ge(psStack_500,psVar10);
  secp256k1_ecmult_odd_multiples_table((int)asStack_260,asStack_400,&sStack_430,&psVar11->x,in_R8);
  psStack_4f0 = asStack_400;
  psStack_4e8 = asStack_260;
  secp256k1_ge_table_set_globalz(4,asStack_260,&asStack_400[0].x);
  lVar8 = 0;
  do {
    secp256k1_ge_mul_lambda
              ((secp256k1_ge *)((long)asStack_400[0].x.n + lVar8),
               (secp256k1_ge *)((long)asStack_260[0].x.n + lVar8));
    lVar8 = lVar8 + 0x68;
  } while (lVar8 != 0x1a0);
  r = &sStack_4a0.y;
  psStack_4e8 = (secp256k1_ge *)&psStack_4e8[1].y;
  psStack_4f0 = (secp256k1_ge *)&psStack_4f0[1].y;
  uVar4 = 0x2a;
  do {
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStack_504);
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStack_504);
    bVar5 = (char)uVar4 * '\x03';
    uVar1 = uStack_504 >> (bVar5 & 0x1f) & 7;
    if (10 < (uint)uVar4) {
      uVar1 = 0;
    }
    uStack_4e0 = uVar4;
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStack_508);
    secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStack_508);
    uStack_4f4 = uStack_508 >> (bVar5 & 0x1f) & 7;
    uVar3 = uVar1 >> 2 ^ 1;
    sStack_4a0.x.n[4] = asStack_260[0].x.n[4];
    sStack_4a0.x.magnitude = asStack_260[0].x.magnitude;
    sStack_4a0.x.normalized = asStack_260[0].x.normalized;
    sStack_4a0.x.n[2] = asStack_260[0].x.n[2];
    sStack_4a0.x.n[3] = asStack_260[0].x.n[3];
    sStack_4a0.x.n[0] = asStack_260[0].x.n[0];
    sStack_4a0.x.n[1] = asStack_260[0].x.n[1];
    sStack_4a0.y.n[4] = asStack_260[0].y.n[4];
    sStack_4a0.y.magnitude = asStack_260[0].y.magnitude;
    sStack_4a0.y.normalized = asStack_260[0].y.normalized;
    sStack_4a0.y.n[2] = asStack_260[0].y.n[2];
    sStack_4a0.y.n[3] = asStack_260[0].y.n[3];
    sStack_4a0.y.n[0] = asStack_260[0].y.n[0];
    sStack_4a0.y.n[1] = asStack_260[0].y.n[1];
    uVar4 = 1;
    psVar10 = psStack_4e8;
    do {
      bVar14 = ((-uVar3 ^ uVar1) & 3) == uVar4;
      secp256k1_fe_cmov(&sStack_4a0.x,(secp256k1_fe *)((long)psVar10 + -0x30),(uint)bVar14);
      secp256k1_fe_cmov(r,&psVar10->x,(uint)bVar14);
      uVar4 = uVar4 + 1;
      psVar10 = (secp256k1_ge *)(((secp256k1_fe *)((long)psVar10 + 0x60))->n + 1);
    } while (uVar4 != 4);
    uVar6 = (uint)uStack_4e0;
    uVar1 = uStack_4f4;
    if (10 < uVar6) {
      uVar1 = 0;
    }
    sStack_4a0.infinity = 0;
    secp256k1_fe_verify(r);
    secp256k1_fe_verify_magnitude((secp256k1_fe *)(sStack_4a0.y._40_8_ & 0xffffffff),1);
    sStack_4d0.n[0] = 0x3ffffbfffff0bc - sStack_4a0.y.n[0];
    sStack_4d0.n[1] = 0x3ffffffffffffc - sStack_4a0.y.n[1];
    sStack_4d0.n[2] = 0x3ffffffffffffc - sStack_4a0.y.n[2];
    sStack_4d0.n[3] = 0x3ffffffffffffc - sStack_4a0.y.n[3];
    sStack_4d0.n[4] = 0x3fffffffffffc - sStack_4a0.y.n[4];
    sStack_4d0.magnitude = 2;
    sStack_4d0.normalized = 0;
    secp256k1_fe_verify(&sStack_4d0);
    secp256k1_fe_cmov(r,&sStack_4d0,uVar3);
    psVar11 = psStack_500;
    if (uVar6 == 0x2a) {
      secp256k1_gej_set_ge(psStack_500,&sStack_4a0);
    }
    else {
      iVar2 = 3;
      do {
        secp256k1_gej_double(psVar11,psVar11);
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
      secp256k1_gej_add_ge(psVar11,psVar11,&sStack_4a0);
    }
    uVar3 = uVar1 >> 2 ^ 1;
    sStack_4a0.x.n[4] = asStack_400[0].x.n[4];
    sStack_4a0.x.magnitude = asStack_400[0].x.magnitude;
    sStack_4a0.x.normalized = asStack_400[0].x.normalized;
    sStack_4a0.x.n[2] = asStack_400[0].x.n[2];
    sStack_4a0.x.n[3] = asStack_400[0].x.n[3];
    sStack_4a0.x.n[0] = asStack_400[0].x.n[0];
    sStack_4a0.x.n[1] = asStack_400[0].x.n[1];
    sStack_4a0.y.n[0] = asStack_400[0].y.n[0];
    sStack_4a0.y.n[1] = asStack_400[0].y.n[1];
    sStack_4a0.y.n[4] = asStack_400[0].y.n[4];
    sStack_4a0.y.magnitude = asStack_400[0].y.magnitude;
    sStack_4a0.y.normalized = asStack_400[0].y.normalized;
    sStack_4a0.y.n[2] = asStack_400[0].y.n[2];
    sStack_4a0.y.n[3] = asStack_400[0].y.n[3];
    uVar4 = 1;
    psVar10 = psStack_4f0;
    do {
      uVar6 = (uint)(((-uVar3 ^ uVar1) & 3) == uVar4);
      secp256k1_fe_cmov(&sStack_4a0.x,(secp256k1_fe *)((long)psVar10 + -0x30),uVar6);
      secp256k1_fe_cmov(r,&psVar10->x,uVar6);
      uVar4 = uVar4 + 1;
      psVar10 = (secp256k1_ge *)(((secp256k1_fe *)((long)psVar10 + 0x60))->n + 1);
    } while (uVar4 != 4);
    sStack_4a0.infinity = 0;
    secp256k1_fe_verify(r);
    secp256k1_fe_verify_magnitude((secp256k1_fe *)(sStack_4a0.y._40_8_ & 0xffffffff),1);
    sStack_4d0.n[0] = 0x3ffffbfffff0bc - sStack_4a0.y.n[0];
    sStack_4d0.n[1] = 0x3ffffffffffffc - sStack_4a0.y.n[1];
    sStack_4d0.n[2] = 0x3ffffffffffffc - sStack_4a0.y.n[2];
    sStack_4d0.n[3] = 0x3ffffffffffffc - sStack_4a0.y.n[3];
    sStack_4d0.n[4] = 0x3fffffffffffc - sStack_4a0.y.n[4];
    sStack_4d0.magnitude = 2;
    sStack_4d0.normalized = 0;
    secp256k1_fe_verify(&sStack_4d0);
    secp256k1_fe_cmov(r,&sStack_4d0,uVar3);
    psVar11 = psStack_500;
    secp256k1_gej_add_ge(psStack_500,psStack_500,&sStack_4a0);
    uVar4 = (ulong)((int)uStack_4e0 - 1);
  } while ((int)uStack_4e0 != 0);
  secp256k1_fe_mul(&psVar11->z,&psVar11->z,&sStack_430);
  return extraout_EAX_00;
}

Assistant:

static int secp256k1_ge_x_frac_on_curve_var(const secp256k1_fe *xn, const secp256k1_fe *xd) {
    /* We want to determine whether (xn/xd) is on the curve.
     *
     * (xn/xd)^3 + 7 is square <=> xd*xn^3 + 7*xd^4 is square (multiplying by xd^4, a square).
     */
     secp256k1_fe r, t;
     VERIFY_CHECK(!secp256k1_fe_normalizes_to_zero_var(xd));

     secp256k1_fe_mul(&r, xd, xn); /* r = xd*xn */
     secp256k1_fe_sqr(&t, xn); /* t = xn^2 */
     secp256k1_fe_mul(&r, &r, &t); /* r = xd*xn^3 */
     secp256k1_fe_sqr(&t, xd); /* t = xd^2 */
     secp256k1_fe_sqr(&t, &t); /* t = xd^4 */
     VERIFY_CHECK(SECP256K1_B <= 31);
     secp256k1_fe_mul_int(&t, SECP256K1_B); /* t = 7*xd^4 */
     secp256k1_fe_add(&r, &t); /* r = xd*xn^3 + 7*xd^4 */
     return secp256k1_fe_is_square_var(&r);
}